

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O1

void jinit_c_master_control(j_compress_ptr cinfo,boolean transcode_only)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  jpeg_error_mgr *pjVar6;
  bool bVar7;
  jpeg_comp_master *pjVar8;
  long lVar9;
  size_t __n;
  int *piVar10;
  ulong uVar11;
  uint *puVar12;
  int iVar13;
  jpeg_scan_info *pjVar14;
  long lVar15;
  boolean *pbVar16;
  ulong uVar17;
  ulong uVar18;
  boolean component_sent [10];
  uint local_a68 [12];
  uint local_a38 [642];
  
  pjVar8 = (jpeg_comp_master *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x38);
  cinfo->master = pjVar8;
  pjVar8->prepare_for_pass = prepare_for_pass;
  pjVar8->pass_startup = pass_startup;
  pjVar8->finish_pass = finish_pass_master;
  pjVar8->is_last_pass = 0;
  if ((((cinfo->image_height == 0) || (cinfo->image_width == 0)) || (cinfo->num_components < 1)) ||
     (cinfo->input_components < 1)) {
    pjVar6 = cinfo->err;
    pjVar6->msg_code = 0x20;
    (*pjVar6->error_exit)((j_common_ptr)cinfo);
  }
  if ((0xffdc < cinfo->image_height) || (0xffdc < cinfo->image_width)) {
    *(undefined8 *)&cinfo->err->msg_code = 0xffdc00000029;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if ((long)cinfo->input_components * (ulong)cinfo->image_width >> 0x20 != 0) {
    pjVar6 = cinfo->err;
    pjVar6->msg_code = 0x46;
    (*pjVar6->error_exit)((j_common_ptr)cinfo);
  }
  iVar13 = cinfo->data_precision;
  if (iVar13 != 8) {
    pjVar6 = cinfo->err;
    pjVar6->msg_code = 0xf;
    (pjVar6->msg_parm).i[0] = iVar13;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar13 = cinfo->num_components;
  if (10 < iVar13) {
    pjVar6 = cinfo->err;
    pjVar6->msg_code = 0x1a;
    (pjVar6->msg_parm).i[0] = iVar13;
    (cinfo->err->msg_parm).i[1] = 10;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  cinfo->max_h_samp_factor = 1;
  cinfo->max_v_samp_factor = 1;
  if (0 < cinfo->num_components) {
    piVar10 = &cinfo->comp_info->h_samp_factor;
    iVar13 = 0;
    do {
      if ((*piVar10 - 5U < 0xfffffffc) || (piVar10[1] - 5U < 0xfffffffc)) {
        pjVar6 = cinfo->err;
        pjVar6->msg_code = 0x12;
        (*pjVar6->error_exit)((j_common_ptr)cinfo);
      }
      uVar18._0_4_ = cinfo->max_h_samp_factor;
      uVar18._4_4_ = cinfo->max_v_samp_factor;
      uVar11 = *(ulong *)piVar10;
      uVar17 = CONCAT44(-(uint)((int)(uVar11 >> 0x20) < (int)uVar18._4_4_),
                        -(uint)((int)uVar11 < (int)(undefined4)uVar18));
      uVar18 = ~uVar17 & uVar11 | uVar18 & uVar17;
      cinfo->max_h_samp_factor = (int)uVar18;
      cinfo->max_v_samp_factor = (int)(uVar18 >> 0x20);
      iVar13 = iVar13 + 1;
      piVar10 = piVar10 + 0x18;
    } while (iVar13 < cinfo->num_components);
  }
  if (0 < cinfo->num_components) {
    pbVar16 = &cinfo->comp_info->component_needed;
    iVar13 = 0;
    do {
      pbVar16[-0xb] = iVar13;
      pbVar16[-3] = 8;
      lVar9 = jdiv_round_up((long)pbVar16[-10] * (ulong)cinfo->image_width,
                            (long)cinfo->max_h_samp_factor << 3);
      pbVar16[-5] = (JDIMENSION)lVar9;
      lVar9 = jdiv_round_up((long)pbVar16[-9] * (ulong)cinfo->image_height,
                            (long)cinfo->max_v_samp_factor << 3);
      pbVar16[-4] = (JDIMENSION)lVar9;
      lVar9 = jdiv_round_up((long)pbVar16[-10] * (ulong)cinfo->image_width,
                            (long)cinfo->max_h_samp_factor);
      pbVar16[-2] = (JDIMENSION)lVar9;
      lVar9 = jdiv_round_up((long)pbVar16[-9] * (ulong)cinfo->image_height,
                            (long)cinfo->max_v_samp_factor);
      pbVar16[-1] = (JDIMENSION)lVar9;
      *pbVar16 = 1;
      iVar13 = iVar13 + 1;
      pbVar16 = pbVar16 + 0x18;
    } while (iVar13 < cinfo->num_components);
  }
  lVar9 = jdiv_round_up((ulong)cinfo->image_height,(long)cinfo->max_v_samp_factor << 3);
  cinfo->total_iMCU_rows = (JDIMENSION)lVar9;
  if (cinfo->scan_info == (jpeg_scan_info *)0x0) {
    cinfo->progressive_mode = 0;
    cinfo->num_scans = 1;
    goto LAB_0011d1fb;
  }
  if (cinfo->num_scans < 1) {
    *(undefined8 *)&cinfo->err->msg_code = 0x13;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pjVar14 = cinfo->scan_info;
  if ((pjVar14->Ss == 0) && (pjVar14->Se == 0x3f)) {
    cinfo->progressive_mode = 0;
    if (0 < (long)cinfo->num_components) {
      __n = (long)cinfo->num_components << 2;
      puVar12 = local_a68;
      iVar13 = 0;
LAB_0011cea1:
      memset(puVar12,iVar13,__n);
    }
  }
  else {
    cinfo->progressive_mode = 1;
    if (0 < (long)cinfo->num_components) {
      __n = (long)cinfo->num_components << 8;
      puVar12 = local_a38;
      iVar13 = 0xff;
      goto LAB_0011cea1;
    }
  }
  if (0 < cinfo->num_scans) {
    iVar13 = 1;
    do {
      uVar1 = pjVar14->comps_in_scan;
      uVar18 = (ulong)uVar1;
      if (uVar1 - 5 < 0xfffffffc) {
        pjVar6 = cinfo->err;
        pjVar6->msg_code = 0x1a;
        (pjVar6->msg_parm).i[0] = uVar1;
        (cinfo->err->msg_parm).i[1] = 4;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      if (0 < (int)uVar1) {
        uVar11 = 0;
        do {
          iVar2 = pjVar14->component_index[uVar11];
          if ((iVar2 < 0) || (cinfo->num_components <= iVar2)) {
            pjVar6 = cinfo->err;
            pjVar6->msg_code = 0x13;
            (pjVar6->msg_parm).i[0] = iVar13;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if ((uVar11 != 0) && (iVar2 <= pjVar14->component_index[uVar11 - 1])) {
            pjVar6 = cinfo->err;
            pjVar6->msg_code = 0x13;
            (pjVar6->msg_parm).i[0] = iVar13;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          uVar11 = uVar11 + 1;
        } while (uVar18 != uVar11);
      }
      uVar3 = pjVar14->Ss;
      iVar2 = pjVar14->Se;
      uVar4 = pjVar14->Ah;
      uVar5 = pjVar14->Al;
      if (cinfo->progressive_mode == 0) {
        if ((((uVar3 != 0) || (iVar2 != 0x3f)) || (uVar4 != 0)) || (uVar5 != 0)) {
          pjVar6 = cinfo->err;
          pjVar6->msg_code = 0x11;
          (pjVar6->msg_parm).i[0] = iVar13;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        if (0 < (int)uVar1) {
          uVar11 = 0;
          do {
            iVar2 = pjVar14->component_index[uVar11];
            if (local_a68[iVar2] != 0) {
              pjVar6 = cinfo->err;
              pjVar6->msg_code = 0x13;
              (pjVar6->msg_parm).i[0] = iVar13;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
            local_a68[iVar2] = 1;
            uVar11 = uVar11 + 1;
          } while (uVar18 != uVar11);
        }
      }
      else {
        if ((0x3f < uVar3) || ((10 < uVar5 || 10 < uVar4) || (0x3f < iVar2 || iVar2 < (int)uVar3)))
        {
          pjVar6 = cinfo->err;
          pjVar6->msg_code = 0x11;
          (pjVar6->msg_parm).i[0] = iVar13;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        if (uVar3 == 0) {
          if (iVar2 != 0) goto LAB_0011cfcd;
        }
        else if (uVar1 != 1) {
LAB_0011cfcd:
          pjVar6 = cinfo->err;
          pjVar6->msg_code = 0x11;
          (pjVar6->msg_parm).i[0] = iVar13;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        if (0 < (int)uVar1) {
          uVar11 = 0;
          do {
            lVar9 = (long)pjVar14->component_index[uVar11];
            if ((uVar3 != 0) && ((int)local_a38[lVar9 * 0x40] < 0)) {
              pjVar6 = cinfo->err;
              pjVar6->msg_code = 0x11;
              (pjVar6->msg_parm).i[0] = iVar13;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
            if ((int)uVar3 <= iVar2) {
              lVar15 = 0;
              do {
                if ((int)local_a38[(long)(int)uVar3 + lVar9 * 0x40 + lVar15] < 0) {
                  if (uVar4 != 0) goto LAB_0011d09d;
                }
                else if (local_a38[(long)(int)uVar3 + lVar9 * 0x40 + lVar15] != uVar4 ||
                         uVar4 - 1 != uVar5) {
LAB_0011d09d:
                  pjVar6 = cinfo->err;
                  pjVar6->msg_code = 0x11;
                  (pjVar6->msg_parm).i[0] = iVar13;
                  (*cinfo->err->error_exit)((j_common_ptr)cinfo);
                }
                local_a38[(long)(int)uVar3 + lVar9 * 0x40 + lVar15] = uVar5;
                lVar15 = lVar15 + 1;
              } while ((iVar2 - uVar3) + 1 != (int)lVar15);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != uVar18);
        }
      }
      pjVar14 = pjVar14 + 1;
      bVar7 = iVar13 < cinfo->num_scans;
      iVar13 = iVar13 + 1;
    } while (bVar7);
  }
  if (cinfo->progressive_mode == 0) {
    if (0 < cinfo->num_components) {
      lVar9 = 0;
      do {
        if (local_a68[lVar9] == 0) {
          pjVar6 = cinfo->err;
          pjVar6->msg_code = 0x2d;
          (*pjVar6->error_exit)((j_common_ptr)cinfo);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < cinfo->num_components);
    }
  }
  else if (0 < cinfo->num_components) {
    puVar12 = local_a38;
    lVar9 = 0;
    do {
      if ((int)*puVar12 < 0) {
        pjVar6 = cinfo->err;
        pjVar6->msg_code = 0x2d;
        (*pjVar6->error_exit)((j_common_ptr)cinfo);
      }
      lVar9 = lVar9 + 1;
      puVar12 = puVar12 + 0x40;
    } while (lVar9 < cinfo->num_components);
  }
LAB_0011d1fb:
  if ((cinfo->progressive_mode != 0) && (cinfo->arith_code == 0)) {
    cinfo->optimize_coding = 1;
  }
  if (transcode_only == 0) {
    *(undefined4 *)&pjVar8[1].prepare_for_pass = 0;
  }
  else if (cinfo->optimize_coding == 0) {
    *(undefined4 *)&pjVar8[1].prepare_for_pass = 2;
  }
  else {
    *(undefined4 *)&pjVar8[1].prepare_for_pass = 1;
  }
  *(undefined4 *)((long)&pjVar8[1].pass_startup + 4) = 0;
  *(undefined4 *)((long)&pjVar8[1].prepare_for_pass + 4) = 0;
  *(int *)&pjVar8[1].pass_startup = cinfo->num_scans << (cinfo->optimize_coding != 0);
  pjVar8[1].finish_pass =
       (_func_void_j_compress_ptr *)"libjpeg-turbo version 2.1.1 (build 20250502)";
  return;
}

Assistant:

GLOBAL(void)
jinit_c_master_control(j_compress_ptr cinfo, boolean transcode_only)
{
  my_master_ptr master;

  master = (my_master_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_comp_master));
  cinfo->master = (struct jpeg_comp_master *)master;
  master->pub.prepare_for_pass = prepare_for_pass;
  master->pub.pass_startup = pass_startup;
  master->pub.finish_pass = finish_pass_master;
  master->pub.is_last_pass = FALSE;

  /* Validate parameters, determine derived values */
  initial_setup(cinfo, transcode_only);

  if (cinfo->scan_info != NULL) {
#ifdef C_MULTISCAN_FILES_SUPPORTED
    validate_script(cinfo);
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    cinfo->progressive_mode = FALSE;
    cinfo->num_scans = 1;
  }

  if (cinfo->progressive_mode && !cinfo->arith_code)  /*  TEMPORARY HACK ??? */
    cinfo->optimize_coding = TRUE; /* assume default tables no good for progressive mode */

  /* Initialize my private state */
  if (transcode_only) {
    /* no main pass in transcoding */
    if (cinfo->optimize_coding)
      master->pass_type = huff_opt_pass;
    else
      master->pass_type = output_pass;
  } else {
    /* for normal compression, first pass is always this type: */
    master->pass_type = main_pass;
  }
  master->scan_number = 0;
  master->pass_number = 0;
  if (cinfo->optimize_coding)
    master->total_passes = cinfo->num_scans * 2;
  else
    master->total_passes = cinfo->num_scans;

  master->jpeg_version = PACKAGE_NAME " version " VERSION " (build " BUILD ")";
}